

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::
     seq_<jsonip::parser::char_<(char)110>,jsonip::parser::char_<(char)117>,jsonip::parser::char_<(char)108>,jsonip::parser::char_<(char)108>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  char *pcVar2;
  iterator __position;
  Reader *pRVar3;
  PositionType pcVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  pointer pSVar8;
  PositionType p;
  undefined1 auStack_20 [8];
  State cur_state;
  
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  __position._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,__position,(State *)auStack_20);
  }
  else {
    (__position._M_current)->pos_ = (PositionType)auStack_20;
    (__position._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pRVar3 = state->reader_;
  pcVar4 = pRVar3->buf_;
  pcVar5 = pRVar3->pos_;
  sVar6 = pRVar3->len_;
  if (((long)pcVar5 - (long)pcVar4 != sVar6) && (*pcVar5 == 'n')) {
    pcVar2 = pcVar5 + 1;
    pRVar3->pos_ = pcVar2;
    if (((long)pcVar2 - (long)pcVar4 != sVar6) && (*pcVar2 == 'u')) {
      pcVar2 = pcVar5 + 2;
      pRVar3->pos_ = pcVar2;
      if (((long)pcVar2 - (long)pcVar4 != sVar6) && (*pcVar2 == 'l')) {
        pcVar2 = pcVar5 + 3;
        pRVar3->pos_ = pcVar2;
        if (((long)pcVar2 - (long)pcVar4 != sVar6) && (*pcVar2 == 'l')) {
          pRVar3->pos_ = pcVar5 + 4;
          bVar7 = true;
          goto LAB_0010b1c4;
        }
      }
    }
  }
  bVar7 = false;
LAB_0010b1c4:
  pcVar4 = pRVar3->pos_;
  if (bVar7 == false) {
    if (state->max_pos_ < pcVar4) {
      state->max_pos_ = pcVar4;
    }
    pRVar3->pos_ = (state->stack_).
                   super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pSVar8 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar8[-1].line_;
  }
  else {
    if (state->max_pos_ < pcVar4) {
      state->max_pos_ = pcVar4;
    }
    pSVar8 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar8 + -1;
  return bVar7;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }